

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UBool icu_63::TimeZoneFormat::toCodePoints(UnicodeString *str,UChar32 *codeArray,int32_t size)

{
  int32_t iVar1;
  UChar32 UVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = 0;
  iVar1 = UnicodeString::countChar32(str,0,0x7fffffff);
  if (iVar1 == size) {
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = uVar5;
    }
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      UVar2 = UnicodeString::char32At(str,(int32_t)uVar5);
      codeArray[uVar6] = UVar2;
      uVar3 = UnicodeString::moveIndex32(str,(int32_t)uVar5,1);
      uVar5 = (ulong)uVar3;
    }
    uVar5 = 1;
  }
  return (UBool)uVar5;
}

Assistant:

UBool
TimeZoneFormat::toCodePoints(const UnicodeString& str, UChar32* codeArray, int32_t size) {
    int32_t count = str.countChar32();
    if (count != size) {
        return FALSE;
    }

    for (int32_t idx = 0, start = 0; idx < size; idx++) {
        codeArray[idx] = str.char32At(start);
        start = str.moveIndex32(start, 1);
    }

    return TRUE;
}